

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clone.cpp
# Opt level: O2

shared_ptr<helics::helicsCLI11App> __thiscall helics::apps::Clone::buildArgParserApp(Clone *this)

{
  App *pAVar1;
  Option *this_00;
  FunctionExecutionFailure *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  string_view message;
  shared_ptr<helics::helicsCLI11App> sVar2;
  allocator<char> local_9a;
  allocator<char> local_99;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  std::make_shared<helics::helicsCLI11App,char_const(&)[39]>((char (*) [39])this);
  pAVar1 = (App *)(this->super_App)._vptr_App;
  if (pAVar1 != (App *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"--allow_iteration",&local_99);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"allow iteration on values",&local_9a);
    this_00 = CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
                        (pAVar1,&local_38,(bool *)(in_RSI + 0xa0),&local_58);
    CLI::Option::ignore_underscore<CLI::App>(this_00,true);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
    pAVar1 = (App *)(this->super_App)._vptr_App;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"--capture,capture",&local_99);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,
               "clone all the interfaces of a particular federate federate capture=\"fed1;fed2\"  supports multiple arguments or a semicolon/comma separated list"
               ,&local_9a);
    CLI::App::
    add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
              (pAVar1,&local_78,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 0x218)
               ,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
    sVar2.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar2.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<helics::helicsCLI11App>)
           sVar2.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_01 = (FunctionExecutionFailure *)__cxa_allocate_exception(0x28);
  message._M_str = "unable to allocate application CLI";
  message._M_len = 0x22;
  FunctionExecutionFailure::FunctionExecutionFailure(this_01,message);
  __cxa_throw(this_01,&FunctionExecutionFailure::typeinfo,HelicsException::~HelicsException);
}

Assistant:

std::shared_ptr<helicsCLI11App> Clone::buildArgParserApp()
{
    auto app = std::make_shared<helicsCLI11App>("Command line options for the Clone App");
    if (!app) {
        throw(FunctionExecutionFailure("unable to allocate application CLI"));
    }
    app->add_flag("--allow_iteration", allow_iteration, "allow iteration on values")
        ->ignore_underscore();

    app->add_option(
        "--capture,capture",
        captureFederate,
        "clone all the interfaces of a particular federate federate capture=\"fed1;fed2\"  "
        "supports multiple arguments or a semicolon/comma separated list");

    return app;
}